

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

picnic_params_t_conflict argument_to_params(char *arg)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  string *in_RDI;
  uint idx;
  istringstream iss;
  string name;
  picnic_params_t_conflict param;
  picnic_params_t_conflict *__end1;
  picnic_params_t_conflict *__begin1;
  picnic_params_t_conflict (*__range1) [12];
  string sarg;
  allocator *lhs;
  picnic_params_t local_214;
  long local_210 [48];
  uint local_90;
  allocator local_89;
  string local_88 [36];
  picnic_params_t local_64;
  picnic_params_t *local_60;
  picnic_params_t *local_58;
  undefined4 *local_50;
  allocator local_31;
  string local_30 [44];
  picnic_params_t local_4;
  
  lhs = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,(char *)in_RDI,lhs);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_50 = &(anonymous_namespace)::all_parameters;
  local_60 = (picnic_params_t *)0x1a65f0;
  for (local_58 = &(anonymous_namespace)::all_parameters; local_58 != local_60;
      local_58 = local_58 + 1) {
    local_64 = *local_58;
    pcVar3 = picnic_get_param_name(local_64);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar3,&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    bVar1 = anon_unknown.dwarf_1d7a9::isequal((string *)lhs,in_RDI);
    if (bVar1) {
      local_4 = local_64;
    }
    local_90 = (uint)bVar1;
    std::__cxx11::string::~string(local_88);
    if (local_90 != 0) goto LAB_0011a00f;
  }
  std::__cxx11::istringstream::istringstream((istringstream *)local_210,local_30,_S_in);
  std::istream::operator>>(local_210,&local_214);
  bVar2 = std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((((bVar2 & 1) == 0) && (local_214 != PARAMETER_SET_INVALID)) &&
     (local_214 < PARAMETER_SET_MAX_INDEX)) {
    local_4 = local_214;
  }
  else {
    local_4 = PARAMETER_SET_INVALID;
  }
  local_90 = 1;
  std::__cxx11::istringstream::~istringstream((istringstream *)local_210);
LAB_0011a00f:
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

picnic_params_t argument_to_params(const char* arg) {
  const std::string sarg{arg};

  for (const auto param : all_parameters) {
    const std::string name{picnic_get_param_name(param)};
    if (isequal(sarg, name)) {
      return param;
    }
  }

  std::istringstream iss{sarg};
  unsigned int idx;
  iss >> idx;
  if (!iss || idx == PARAMETER_SET_INVALID || idx >= PARAMETER_SET_MAX_INDEX) {
    return PARAMETER_SET_INVALID;
  }

  return static_cast<picnic_params_t>(idx);
}